

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_graphsensing.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  type *ptVar2;
  int num_rollouts_00;
  ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_long,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_long>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *poVar3;
  int iVar4;
  char *pcVar5;
  typed_value<unsigned_int,_char> *ptVar6;
  typed_value<pgi::PolicyInitialization,_char> *ptVar7;
  typed_value<unsigned_long,_char> *ptVar8;
  typed_value<int,_char> *ptVar9;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar10;
  typed_value<bool,_char> *ptVar11;
  typed_value<double,_char> *ptVar12;
  basic_command_line_parser<char> *this;
  size_type sVar13;
  ostream *poVar14;
  any *paVar15;
  uint *puVar16;
  runtime_error *this_00;
  bool *pbVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  joint_vertex_t jVar19;
  long lVar20;
  long lVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  DiscreteSpace<pgi::DiscreteAction> *d;
  DiscreteSpace<pgi::DiscreteObservation> *d_00;
  DiscreteSpace<pgi::DiscreteAction> *d_01;
  DiscreteSpace<pgi::DiscreteObservation> *d_02;
  DiscreteSpace<pgi::DiscreteAction> *d_03;
  DiscreteSpace<pgi::DiscreteObservation> *d_04;
  uint uVar22;
  size_type sVar23;
  _Alloc_hider _Var24;
  PolicyGraph *g;
  ulong uVar25;
  uint uVar26;
  unsigned_long *qq;
  ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_long,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_long>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *poVar27;
  double dVar28;
  BackPassProperties *in_stack_ffffffffffffe5e8;
  long local_1a10;
  int num_particles_fwd;
  long local_1a00;
  int num_rollouts;
  double local_19f0;
  int improvement_steps;
  long local_19e0;
  PolicyInitialization policy_initialization;
  int num_particle_rollout;
  uint width;
  uint rng_seed;
  string local_19c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19a8;
  double sy;
  double sx;
  double my;
  double mx;
  ParticleSet<pgi::GraphSensing::state_t> init_particles;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_policy_graphs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1900;
  size_t blind_policy_initial_joint_action;
  uint horizon;
  JointActionSpace jas;
  string local_1878;
  StateTransitionModel t;
  RewardModel r;
  JointObservationSpace jos;
  string local_17a0;
  ImprovementResult bp;
  JointPolicy jp;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1658 [144];
  undefined1 local_15c8 [24];
  ostringstream ss;
  joint_vertex_t *local_15a8;
  RSSObservationModel o;
  ForwardPassParticle<pgi::GraphSensing::state_t> fwd;
  ParticleSet<pgi::GraphSensing::state_t> local_11c8;
  ofstream fvalue;
  options_description cmdline_options;
  options_description config;
  ofstream fs;
  ofstream ftime;
  JointPolicy local_a80;
  PRNG rng;
  
  std::__cxx11::string::string((string *)&ftime,*argv,(allocator *)&fs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fvalue,
                 "NPGI planner for (Dec)POMDPs \nUsage: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftime);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rng,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fvalue,
                 " [OPTION]...\nOptions");
  uVar22 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar26 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&config,(string *)&rng,
             (uint)boost::program_options::options_description::m_default_line_length,uVar26);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::~string((string *)&fvalue);
  std::__cxx11::string::~string((string *)&ftime);
  _fvalue = (pointer)boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&fvalue,"help");
  ptVar6 = boost::program_options::value<unsigned_int>(&horizon);
  bp.improved_policy.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
  super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb._0_4_ = 3;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,(uint *)&bp);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"horizon,h",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>(&width);
  jp.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
  super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb._0_4_ = 3;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,(uint *)&jp);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"policy-width,w",(char *)ptVar6);
  ptVar7 = boost::program_options::value<pgi::PolicyInitialization>(&policy_initialization);
  _cmdline_options = 0;
  ptVar7 = boost::program_options::typed_value<pgi::PolicyInitialization,_char>::default_value
                     (ptVar7,(PolicyInitialization *)&cmdline_options);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"policy-initialization,p",(char *)ptVar7);
  ptVar8 = boost::program_options::value<unsigned_long>(&blind_policy_initial_joint_action);
  _ftime = (pointer)0x0;
  ptVar8 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar8,(unsigned_long *)&ftime);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"blind-action,b",(char *)ptVar8);
  ptVar9 = boost::program_options::value<int>(&improvement_steps);
  o.index_to_xy_loc_._M_t._M_impl._0_4_ = 9;
  ptVar9 = boost::program_options::typed_value<int,_char>::default_value(ptVar9,(int *)&o);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"improvement-steps,i",(char *)ptVar9);
  ptVar9 = boost::program_options::value<int>(&num_rollouts);
  jas.super_IndexSpace<unsigned_long>._vptr_IndexSpace._0_4_ = 100;
  ptVar9 = boost::program_options::typed_value<int,_char>::default_value(ptVar9,(int *)&jas);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"num-rollouts,r",(char *)ptVar9);
  ptVar9 = boost::program_options::value<int>(&num_particle_rollout);
  jos.super_IndexSpace<unsigned_long>._vptr_IndexSpace._0_4_ = 100;
  ptVar9 = boost::program_options::typed_value<int,_char>::default_value(ptVar9,(int *)&jos);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"num-particles-rollout,k",(char *)ptVar9);
  ptVar9 = boost::program_options::value<int>(&num_particles_fwd);
  init_particles.states_.
  super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(init_particles.states_.
                         super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1000);
  ptVar9 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar9,(int *)&init_particles);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"num-particles,n",(char *)ptVar9);
  ptVar6 = boost::program_options::value<unsigned_int>(&rng_seed);
  t.moves_.allowed_next_locations_._M_t._M_impl._0_4_ = 0x499602d2;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar6,(uint *)&t)
  ;
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"seed,s",(char *)ptVar6);
  ptVar10 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&rng,"./",(allocator *)&r);
  ptVar10 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&rng);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"output-prefix,o",(char *)ptVar10);
  ptVar11 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_19a8._M_dataplus._M_p._0_1_ = 0;
  ptVar11 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar11,(bool *)&local_19a8);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"gaussian",(char *)ptVar11);
  ptVar12 = boost::program_options::value<double>(&mx);
  _fs = (pointer)0x3fb999999999999a;
  ptVar12 = boost::program_options::typed_value<double,_char>::default_value(ptVar12,(double *)&fs);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"mx",(char *)ptVar12);
  ptVar12 = boost::program_options::value<double>(&my);
  fwd.m_._M_t._M_impl._0_8_ = 0x3fb999999999999a;
  ptVar12 = boost::program_options::typed_value<double,_char>::default_value(ptVar12,(double *)&fwd)
  ;
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"my",(char *)ptVar12);
  ptVar12 = boost::program_options::value<double>(&sx);
  _ss = (pointer)0x3fb999999999999a;
  ptVar12 = boost::program_options::typed_value<double,_char>::default_value(ptVar12,(double *)&ss);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"sx",(char *)ptVar12);
  ptVar12 = boost::program_options::value<double>(&sy);
  _vm = 0x3fb999999999999a;
  ptVar12 = boost::program_options::typed_value<double,_char>::default_value(ptVar12,(double *)&vm);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"sy",(char *)ptVar12);
  std::__cxx11::string::~string((string *)&rng);
  boost::program_options::options_description::options_description(&cmdline_options,uVar22,uVar26);
  boost::program_options::options_description::add(&cmdline_options);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&rng,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&rng,&cmdline_options);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&fvalue,this);
  boost::program_options::store((basic_parsed_options *)&fvalue,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&fvalue);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&rng);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&rng,"help",(allocator *)&fvalue);
  sVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_1658,(key_type *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  if (sVar13 == 0) {
    pgi::PRNG::PRNG(&rng,rng_seed);
    pgi::JointDiscreteSpace<pgi::DiscreteAction>::JointDiscreteSpace
              (&jas,(JointDiscreteSpace<pgi::DiscreteAction> *)pgi::GraphSensing::joint_action_space
              );
    pgi::GraphSensing::MovementModel::MovementModel(&t.moves_);
    pgi::GraphSensing::MovementModel::MovementModel(&r.moves_);
    pgi::JointDiscreteSpace<pgi::DiscreteObservation>::JointDiscreteSpace
              (&jos,(JointDiscreteSpace<pgi::DiscreteObservation> *)
                    pgi::GraphSensing::rss_joint_observation_space);
    pgi::GraphSensing::RSSObservationModel::RSSObservationModel(&o);
    local_policy_graphs.
    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_policy_graphs.
    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_policy_graphs.
    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar25 = 0;
    while( true ) {
      if ((ulong)(((long)jas.local_.
                         super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)jas.local_.
                        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar25) break;
      std::__cxx11::string::string((string *)&ftime,"horizon",(allocator *)&fs);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      puVar16 = boost::any_cast<unsigned_int_const&>(paVar15);
      pgi::fixed_width((PolicyGraph *)&fvalue,*puVar16,(ulong)width,
                       jas.super_IndexSpace<unsigned_long>.num_elements_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar25],
                       jos.super_IndexSpace<unsigned_long>.num_elements_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar25]);
      std::
      vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
      ::
      emplace_back<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>
                ((vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
                  *)&local_policy_graphs,(PolicyGraph *)&fvalue);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
      ::~adjacency_list((PolicyGraph *)&fvalue);
      std::__cxx11::string::~string((string *)&ftime);
      uVar25 = uVar25 + 1;
    }
    if (policy_initialization == random) {
      pgi::set_random(&local_policy_graphs,&rng);
    }
    else if (policy_initialization == blind) {
      pgi::set_random(&local_policy_graphs,&rng);
      pgi::set_blind(&local_policy_graphs,blind_policy_initial_joint_action,&jas);
    }
    else if (policy_initialization == greedy) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "Greedy open loop initialization not implemented for continuous-state problems!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgi::JointPolicy::JointPolicy(&jp,&local_policy_graphs);
    init_particles.weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    init_particles.weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    init_particles.nodes_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    init_particles.nodes_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    init_particles.states_.
    super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    init_particles.nodes_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    init_particles.states_.
    super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    init_particles.states_.
    super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    init_particles.weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&fvalue,"gaussian",(allocator *)&ftime);
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar17 = boost::any_cast<bool_const&>(paVar15);
    bVar1 = *pbVar17;
    std::__cxx11::string::~string((string *)&fvalue);
    if (bVar1 == true) {
      _fvalue = (pointer)mx;
      pgi::GraphSensing::sample_initial_states_gaussian
                (&init_particles.states_,num_particles_fwd,(location_t *)&fvalue,sx,sy,&rng);
    }
    else {
      pgi::GraphSensing::sample_initial_states(&init_particles.states_,num_particles_fwd,&rng);
    }
    sVar23 = (size_type)num_particles_fwd;
    _ftime = (pointer)pgi::JointPolicy::root(&jp);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fvalue,sVar23,
               (value_type_conflict2 *)&ftime,(allocator_type *)&fs);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&init_particles.nodes_,&fvalue);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&fvalue);
    _ftime = (pointer)(1.0 / (double)num_particles_fwd);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&fvalue,(long)num_particles_fwd,
               (value_type_conflict3 *)&ftime,(allocator_type *)&fs);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&init_particles.weights_,&fvalue);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&fvalue);
    std::__cxx11::string::string((string *)&fs,"output-prefix",(allocator *)&fwd);
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftime,
                   pbVar18,"policy_values.txt");
    std::ofstream::ofstream(&fvalue,(string *)&ftime,_S_out);
    std::__cxx11::string::~string((string *)&ftime);
    std::__cxx11::string::~string((string *)&fs);
    std::__cxx11::string::string((string *)&fwd,"output-prefix",(allocator *)&ss);
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs,pbVar18,
                   "duration_microseconds.txt");
    std::ofstream::ofstream(&ftime,(string *)&fs,_S_out);
    std::__cxx11::string::~string((string *)&fs);
    std::__cxx11::string::~string((string *)&fwd);
    iVar4 = num_rollouts;
    jVar19 = pgi::JointPolicy::root(&jp);
    local_19f0 = pgi::
                 estimate_value<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                           (iVar4,&init_particles.states_,&init_particles.weights_,&jp,jVar19,&t,&o,
                            &r,&jas,&jos,&rng);
    poVar14 = std::ostream::_M_insert<double>(local_19f0);
    std::endl<char,std::char_traits<char>>(poVar14);
    std::operator<<((ostream *)&std::cout,"Policy value: ");
    poVar14 = std::ostream::_M_insert<double>(local_19f0);
    std::endl<char,std::char_traits<char>>(poVar14);
    local_19e0 = 0;
    local_1a00 = 0;
    uVar25 = 0;
    while( true ) {
      if ((ulong)(((long)jas.local_.
                         super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)jas.local_.
                        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar25) break;
      std::__cxx11::string::string((string *)&local_19a8,"output-prefix",(allocator *)&local_1900);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      lVar20 = local_1a00;
      pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bp,
                     pbVar18,"best_policy_agent");
      std::__cxx11::to_string(&local_19c8,uVar25);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bp,
                     &local_19c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fwd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,".dot"
                    );
      std::ofstream::ofstream(&fs,(string *)&fwd,_S_out);
      std::__cxx11::string::~string((string *)&fwd);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&local_19c8);
      std::__cxx11::string::~string((string *)&bp);
      std::__cxx11::string::~string((string *)&local_19a8);
      g = (PolicyGraph *)
          ((long)&((jp.locals_.
                    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_type).m_edges.
                  super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next + local_19e0);
      pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fwd,(pgi *)((long)&((jas.local_.
                                          super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->v_).
                                        super__Vector_base<pgi::DiscreteAction,_std::allocator<pgi::DiscreteAction>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20),d);
      pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ss,(pgi *)((long)&((jos.local_.
                                         super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->v_).
                                       super__Vector_base<pgi::DiscreteObservation,_std::allocator<pgi::DiscreteObservation>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20),d_00);
      pgi::print((ostream *)&fs,g,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fwd,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ss);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ss);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&fwd);
      std::ofstream::~ofstream((ostream *)&fs);
      uVar25 = uVar25 + 1;
      local_1a00 = local_1a00 + 0x18;
      local_19e0 = local_19e0 + 0x38;
    }
    std::__cxx11::string::string((string *)&ss,"output-prefix",(allocator *)&bp);
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fwd,pbVar18
                   ,"best_value.txt");
    std::ofstream::ofstream(&fs,(string *)&fwd,_S_out);
    std::__cxx11::string::~string((string *)&fwd);
    std::__cxx11::string::~string((string *)&ss);
    poVar14 = std::ostream::_M_insert<double>(local_19f0);
    std::endl<char,std::char_traits<char>>(poVar14);
    local_15c8[0x10] = 0;
    local_15c8._0_4_ = 0;
    local_15c8._4_4_ = 0x3fe00000;
    local_15c8._8_4_ = 0x9999999a;
    local_15c8._12_4_ = 0x3fa99999;
    iVar4 = 1;
    while (local_1a00 = CONCAT44(local_1a00._4_4_,iVar4), iVar4 <= improvement_steps) {
      std::__cxx11::string::string((string *)&fwd,"gaussian",(allocator *)&ss);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar17 = boost::any_cast<bool_const&>(paVar15);
      bVar1 = *pbVar17;
      std::__cxx11::string::~string((string *)&fwd);
      if (bVar1 == true) {
        fwd.m_._M_t._M_impl._0_8_ = mx;
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = my;
        pgi::GraphSensing::sample_initial_states_gaussian
                  (&init_particles.states_,num_particles_fwd,(location_t *)&fwd,sx,sy,&rng);
      }
      else {
        pgi::GraphSensing::sample_initial_states(&init_particles.states_,num_particles_fwd,&rng);
      }
      sVar23 = (size_type)num_particles_fwd;
      _ss = (pointer)pgi::JointPolicy::root(&jp);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fwd,sVar23,
                 (value_type_conflict2 *)&ss,(allocator_type *)&bp);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (&init_particles.nodes_,&fwd);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&fwd);
      _ss = (pointer)(1.0 / (double)num_particles_fwd);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&fwd,(long)num_particles_fwd,
                 (value_type_conflict3 *)&ss,(allocator_type *)&bp);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&init_particles.weights_,&fwd);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&fwd);
      lVar20 = std::chrono::_V2::system_clock::now();
      num_rollouts_00 = num_particle_rollout;
      iVar4 = num_rollouts;
      pgi::JointPolicy::JointPolicy(&local_a80,&jp);
      pgi::backpass::
      improve_particle<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                (&bp,(backpass *)(ulong)(uint)iVar4,num_rollouts_00,(int)&init_particles,
                 (ParticleSet<pgi::GraphSensing::state_t> *)&local_a80,(JointPolicy *)&t,
                 (StateTransitionModel *)&o,(RSSObservationModel *)&r,(RewardModel *)&jas,
                 (JointActionSpace *)&jos,(JointObservationSpace *)&rng,(PRNG *)local_15c8,
                 in_stack_ffffffffffffe5e8);
      pgi::JointPolicy::~JointPolicy(&local_a80);
      lVar21 = std::chrono::_V2::system_clock::now();
      local_19e0 = (lVar21 - lVar20) / 1000;
      poVar14 = std::ostream::_M_insert<long>((long)&ftime);
      std::endl<char,std::char_traits<char>>(poVar14);
      iVar4 = num_rollouts;
      jVar19 = pgi::JointPolicy::root(&bp.improved_policy);
      dVar28 = pgi::
               estimate_value<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                         (iVar4,&init_particles.states_,&init_particles.weights_,&bp.improved_policy
                          ,jVar19,&t,&o,&r,&jas,&jos,&rng);
      poVar14 = std::ostream::_M_insert<double>(dVar28);
      std::endl<char,std::char_traits<char>>(poVar14);
      if (local_19f0 < dVar28) {
        pgi::JointPolicy::operator=(&jp,&bp.improved_policy);
        lVar20 = 0;
        lVar21 = 0;
        uVar25 = 0;
        while( true ) {
          if ((ulong)(((long)jas.local_.
                             super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)jas.local_.
                            super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar25) break;
          std::__cxx11::string::string
                    ((string *)&local_1900,"output-prefix",(allocator *)&local_17a0);
          paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm)
          ;
          pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
          std::operator+(&local_19c8,pbVar18,"best_policy_agent");
          std::__cxx11::to_string(&local_1878,uVar25);
          std::operator+(&local_19a8,&local_19c8,&local_1878);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         &local_19a8,".dot");
          std::ofstream::ofstream(&fwd,(string *)&ss,_S_out);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&local_19a8);
          std::__cxx11::string::~string((string *)&local_1878);
          std::__cxx11::string::~string((string *)&local_19c8);
          std::__cxx11::string::~string((string *)&local_1900);
          ptVar2 = &(jp.locals_.
                     super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_type;
          pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ss,(pgi *)((long)&((jas.local_.
                                             super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->v_).
                                           super__Vector_base<pgi::DiscreteAction,_std::allocator<pgi::DiscreteAction>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar21),d_01)
          ;
          pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_19a8,
                     (pgi *)((long)&((jos.local_.
                                      super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->v_).
                                    super__Vector_base<pgi::DiscreteObservation,_std::allocator<pgi::DiscreteObservation>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar21),d_02);
          pgi::print((ostream *)&fwd,
                     (PolicyGraph *)
                     ((long)&(ptVar2->m_edges).
                             super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next + lVar20),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ss,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_19a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_19a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ss);
          std::ofstream::~ofstream((ostream *)&fwd);
          uVar25 = uVar25 + 1;
          lVar21 = lVar21 + 0x18;
          lVar20 = lVar20 + 0x38;
        }
        std::__cxx11::string::string((string *)&local_19a8,"output-prefix",(allocator *)&local_19c8)
        ;
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       pbVar18,"best_value.txt");
        std::ofstream::ofstream(&fwd,(string *)&ss,_S_out);
        std::__cxx11::string::~string((string *)&ss);
        std::__cxx11::string::~string((string *)&local_19a8);
        poVar14 = std::ostream::_M_insert<double>(dVar28);
        std::endl<char,std::char_traits<char>>(poVar14);
        std::ofstream::~ofstream(&fwd);
        local_19f0 = dVar28;
      }
      poVar14 = std::operator<<((ostream *)&std::cout,"Step ");
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)local_1a00);
      poVar14 = std::operator<<(poVar14," of ");
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,improvement_steps);
      std::operator<<(poVar14,": ");
      poVar14 = std::ostream::_M_insert<double>(dVar28);
      std::operator<<(poVar14," (best: ");
      poVar14 = std::ostream::_M_insert<double>(local_19f0);
      poVar14 = std::operator<<(poVar14,")");
      poVar14 = std::operator<<(poVar14,", ");
      poVar14 = std::ostream::_M_insert<long>((long)poVar14);
      poVar14 = std::operator<<(poVar14," microseconds");
      std::endl<char,std::char_traits<char>>(poVar14);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::__cxx11::string::string((string *)&fwd,"output-prefix",(allocator *)&local_19a8);
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      poVar14 = std::operator<<((ostream *)&ss,(string *)pbVar18);
      poVar14 = std::operator<<(poVar14,"/step");
      *(undefined8 *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x10) = 3;
      poVar14 = std::operator<<(poVar14,0x30);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)local_1a00);
      std::operator<<(poVar14,"_");
      std::__cxx11::string::~string((string *)&fwd);
      local_1a10 = 0;
      lVar20 = 0;
      for (uVar25 = 0;
          uVar25 < (ulong)(((long)jas.local_.
                                  super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)jas.local_.
                                 super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar25 = uVar25 + 1) {
        std::__cxx11::stringbuf::str();
        std::operator+(&local_1900,&local_1878,"agent");
        std::__cxx11::to_string(&local_17a0,uVar25);
        std::operator+(&local_19c8,&local_1900,&local_17a0);
        std::operator+(&local_19a8,&local_19c8,".dot");
        std::ofstream::ofstream(&fwd,(string *)&local_19a8,_S_out);
        std::__cxx11::string::~string((string *)&local_19a8);
        std::__cxx11::string::~string((string *)&local_19c8);
        std::__cxx11::string::~string((string *)&local_17a0);
        std::__cxx11::string::~string((string *)&local_1900);
        std::__cxx11::string::~string((string *)&local_1878);
        ptVar2 = &(bp.improved_policy.locals_.
                   super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_type;
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_19a8,
                   (pgi *)((long)&((jas.local_.
                                    super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->v_).
                                  super__Vector_base<pgi::DiscreteAction,_std::allocator<pgi::DiscreteAction>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar20),d_03);
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_19c8,
                   (pgi *)((long)&((jos.local_.
                                    super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->v_).
                                  super__Vector_base<pgi::DiscreteObservation,_std::allocator<pgi::DiscreteObservation>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar20),d_04);
        pgi::print((ostream *)&fwd,
                   (PolicyGraph *)
                   ((long)&(ptVar2->m_edges).
                           super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next + local_1a10),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_19a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_19c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_19c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_19a8);
        std::ofstream::~ofstream((ostream *)&fwd);
        lVar20 = lVar20 + 0x18;
        local_1a10 = local_1a10 + 0x38;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      pgi::JointPolicy::~JointPolicy(&bp.improved_policy);
      iVar4 = (int)local_1a00 + 1;
    }
    pgi::ParticleSet<pgi::GraphSensing::state_t>::ParticleSet(&local_11c8,&init_particles);
    pgi::ForwardPassParticle<pgi::GraphSensing::state_t>::
    ForwardPassParticle<pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel>
              (&fwd,&local_11c8,&jp,&t,&o,&jas,&jos,&rng);
    pgi::ParticleSet<pgi::GraphSensing::state_t>::~ParticleSet(&local_11c8);
    std::operator<<((ostream *)&std::cout,"Forward pass results: \n");
    uVar22 = 1;
    while( true ) {
      uVar26 = pgi::JointPolicy::max_steps(&jp);
      if (uVar26 < uVar22) break;
      local_1a00 = CONCAT44(local_1a00._4_4_,uVar22);
      pgi::JointPolicy::joint_vertices_with_steps_remaining
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ss,&jp,uVar22);
      for (_Var24._M_p = _ss; (joint_vertex_t *)_Var24._M_p != local_15a8;
          _Var24._M_p = _Var24._M_p + 8) {
        __x = pgi::JointPolicy::to_local(&jp,*(joint_vertex_t *)_Var24._M_p);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bp,__x);
        poVar3 = bp.improved_policy.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
                 super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb.
                 data;
        for (poVar27 = (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_long,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_long>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                        *)CONCAT44(bp.improved_policy.vm.super_relation_set.
                                   super_set_adaptor<_a9378c49_>.
                                   super_ordered_associative_container_adaptor<_4bc0be94_>.
                                   super_type.super_type.dwfb._4_4_,
                                   bp.improved_policy.vm.super_relation_set.
                                   super_set_adaptor<_a9378c49_>.
                                   super_ordered_associative_container_adaptor<_4bc0be94_>.
                                   super_type.super_type.dwfb._0_4_); poVar27 != poVar3;
            poVar27 = poVar27 + 4) {
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::operator<<(poVar14," ");
        }
        pgi::ForwardPassParticle<pgi::GraphSensing::state_t>::particles_at
                  (&fwd,*(joint_vertex_t *)_Var24._M_p);
        poVar14 = std::operator<<((ostream *)&std::cout,": ");
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        std::operator<<(poVar14," particles\n");
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&bp);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ss);
      uVar22 = (int)local_1a00 + 1;
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>,_std::_Select1st<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>,_std::_Select1st<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>_>
                 *)&fwd);
    std::ofstream::~ofstream(&fs);
    std::ofstream::~ofstream(&ftime);
    std::ofstream::~ofstream(&fvalue);
    pgi::ParticleSet<pgi::GraphSensing::state_t>::~ParticleSet(&init_particles);
    pgi::JointPolicy::~JointPolicy(&jp);
    std::
    vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ::~vector(&local_policy_graphs);
    std::
    _Rb_tree<int,_std::pair<const_int,_pgi::GraphSensing::location_t>,_std::_Select1st<std::pair<const_int,_pgi::GraphSensing::location_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pgi::GraphSensing::location_t>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pgi::GraphSensing::location_t>,_std::_Select1st<std::pair<const_int,_pgi::GraphSensing::location_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pgi::GraphSensing::location_t>_>_>
                 *)&o);
    pgi::JointDiscreteSpace<pgi::DiscreteObservation>::~JointDiscreteSpace(&jos);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&r);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&t);
    pgi::JointDiscreteSpace<pgi::DiscreteAction>::~JointDiscreteSpace(&jas);
    iVar4 = 0;
  }
  else {
    poVar14 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&config);
    std::endl<char,std::char_traits<char>>(poVar14);
    iVar4 = 1;
  }
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&cmdline_options);
  boost::program_options::options_description::~options_description(&config);
  return iVar4;
}

Assistant:

int main(int argc, char** argv) {
  unsigned int rng_seed;
  unsigned int horizon;
  unsigned int width;
  int improvement_steps;
  int num_particles_fwd;
  int num_rollouts;
  int num_particle_rollout;
  std::size_t blind_policy_initial_joint_action;
  pgi::PolicyInitialization policy_initialization;

  double mx, my, sx, sy;  // optional gaussian initial belief params

  namespace po = boost::program_options;
  po::options_description config("NPGI planner for (Dec)POMDPs \nUsage: " +
                                 std::string(argv[0]) +
                                 " [OPTION]...\nOptions");
  config.add_options()("help", "produce help message")(
      "horizon,h", po::value<unsigned int>(&horizon)->default_value(3),
      "problem horizon")("policy-width,w",
                         po::value<unsigned int>(&width)->default_value(3),
                         "policy width")(
      "policy-initialization,p",
      po::value<pgi::PolicyInitialization>(&policy_initialization)
          ->default_value(pgi::PolicyInitialization::random),
      "policy initialization type: (random | greedy | blind)")(
      "blind-action,b",
      po::value<std::size_t>(&blind_policy_initial_joint_action)
          ->default_value(0),
      "action for blind policy initialization")(
      "improvement-steps,i",
      po::value<int>(&improvement_steps)->default_value(9),
      "number of policy improvement steps")(
      "num-rollouts,r",
      po::value<int>(&num_rollouts)->default_value(100),
      "number of rollouts for value estimation")
      (
      "num-particles-rollout,k", po::value<int>(&num_particle_rollout)->default_value(100),
      "number of particles per rollout")(
      "num-particles,n", po::value<int>(&num_particles_fwd)->default_value(1000),
      "number of particles in P(s,q) forward pass")(
      "seed,s", po::value<unsigned int>(&rng_seed)->default_value(1234567890),
      "random number seed")(
      "output-prefix,o", po::value<std::string>()->default_value("./"),
      "output prefix")("gaussian", po::bool_switch()->default_value(false),
                       "toggle for Gaussian initial belief")(
      "mx", po::value<double>(&mx)->default_value(0.1),
      "initial belief mean x value")("my",
                                     po::value<double>(&my)->default_value(0.1),
                                     "initial belief mean y value")(
      "sx", po::value<double>(&sx)->default_value(0.1),
      "initial belief x value standard deviation")(
      "sy", po::value<double>(&sy)->default_value(0.1),
      "initial belief y value standard deviation");

  po::options_description cmdline_options;
  cmdline_options.add(config);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv).options(cmdline_options).run(),
            vm);
  po::notify(vm);
  if (vm.count("help")) {
    std::cout << config << std::endl;
    return 1;
  }

  pgi::PRNG rng(rng_seed);

  // Create the GraphSensing Dec-POMDP problem
  pgi::JointActionSpace jas = pgi::GraphSensing::joint_action_space;
  pgi::GraphSensing::StateTransitionModel t;
  pgi::GraphSensing::RewardModel r;

  // RSS
  pgi::JointObservationSpace jos =
      pgi::GraphSensing::rss_joint_observation_space;
  pgi::GraphSensing::RSSObservationModel o;

  // Initialize policy
  std::vector<pgi::PolicyGraph> local_policy_graphs;
  for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
    local_policy_graphs.emplace_back(pgi::fixed_width(
        vm["horizon"].as<unsigned int>(), width, jas.num_local_indices(agent),
        jos.num_local_indices(agent)));
  }

  if (policy_initialization == pgi::PolicyInitialization::random) {
    pgi::set_random(local_policy_graphs, rng);
  } else if (policy_initialization == pgi::PolicyInitialization::greedy) {
    throw std::runtime_error(
        "Greedy open loop initialization not implemented for continuous-state "
        "problems!");
  } else if (policy_initialization == pgi::PolicyInitialization::blind) {
    pgi::set_random(local_policy_graphs,
                    rng);  // to randomize the edges in the policy
    pgi::set_blind(local_policy_graphs, blind_policy_initial_joint_action, jas);
  }
  pgi::JointPolicy jp(local_policy_graphs);

  // Create initial belief
  pgi::ParticleSet<pgi::GraphSensing::state_t> init_particles;
  if (vm["gaussian"].as<bool>()) {
    pgi::GraphSensing::sample_initial_states_gaussian(
        init_particles.states_, num_particles_fwd,
        pgi::GraphSensing::location_t{mx, my}, sx, sy, rng);
  } else {
    pgi::GraphSensing::sample_initial_states(init_particles.states_,
                                             num_particles_fwd, rng);
  }
  init_particles.nodes_ =
      std::vector<pgi::JointPolicy::joint_vertex_t>(num_particles_fwd, jp.root());
  init_particles.weights_ = std::vector<double>(
      num_particles_fwd, 1.0 / static_cast<double>(num_particles_fwd));

  // Set up output streams
  std::ofstream fvalue(vm["output-prefix"].as<std::string>() +
                       "policy_values.txt");
  std::ofstream ftime(vm["output-prefix"].as<std::string>() +
                      "duration_microseconds.txt");

  // Get value of initial policy
  double best_value = estimate_value(num_rollouts, init_particles.states_,
                                     init_particles.weights_, jp, jp.root(), t,
                                     o, r, jas, jos, rng);

  fvalue << best_value << std::endl;
  std::cout << "Policy value: " << best_value << std::endl;

  // write initial best policy and value
  for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
    std::ofstream fs(vm["output-prefix"].as<std::string>() +
                     "best_policy_agent" + std::to_string(agent) + ".dot");
    print(fs, jp.local_policy(agent), pgi::element_names(jas.get(agent)),
          pgi::element_names(jos.get(agent)));
  }

  std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
  fs << best_value << std::endl;

  // Backward pass setup
  pgi::backpass::BackPassProperties props;
  props.prob_random_history_in_heuristic_improvement = 0.05;

  for (int i = 1; i <= improvement_steps; ++i) {

    // sample new set of particles for improvement
    if (vm["gaussian"].as<bool>()) {
      pgi::GraphSensing::sample_initial_states_gaussian(
          init_particles.states_, num_particles_fwd,
          pgi::GraphSensing::location_t{mx, my}, sx, sy, rng);
    } else {
      pgi::GraphSensing::sample_initial_states(init_particles.states_,
                                               num_particles_fwd, rng);
    }
    init_particles.nodes_ =
        std::vector<pgi::JointPolicy::joint_vertex_t>(num_particles_fwd, jp.root());
    init_particles.weights_ = std::vector<double>(
        num_particles_fwd, 1.0 / static_cast<double>(num_particles_fwd));

    std::chrono::high_resolution_clock::time_point t1 =
        std::chrono::high_resolution_clock::now();
    auto bp = pgi::backpass::improve_particle(num_rollouts, num_particle_rollout, init_particles, jp, t, o, r, jas,
                                              jos, rng, props);
    std::chrono::high_resolution_clock::time_point t3 =
        std::chrono::high_resolution_clock::now();
    auto duration =
        std::chrono::duration_cast<std::chrono::microseconds>(t3 - t1).count();
    ftime << duration << std::endl;

    // check
    double improved_policy_value = estimate_value(
        num_rollouts, init_particles.states_, init_particles.weights_, bp.improved_policy,
        bp.improved_policy.root(), t, o, r, jas, jos, rng);

    fvalue << improved_policy_value << std::endl;

    if (improved_policy_value > best_value) {
      best_value = improved_policy_value;
      jp = bp.improved_policy;

      // Update best value and policy!
      for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
        std::ofstream fs(vm["output-prefix"].as<std::string>() +
                         "best_policy_agent" + std::to_string(agent) + ".dot");
        print(fs, jp.local_policy(agent), pgi::element_names(jas.get(agent)),
              pgi::element_names(jos.get(agent)));
      }

      std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
      fs << best_value << std::endl;
    }

    std::cout << "Step " << i << " of " << improvement_steps << ": "
              << improved_policy_value << " (best: " << best_value << ")"
              << ", " << duration << " microseconds" << std::endl;

    std::ostringstream ss;
    ss << vm["output-prefix"].as<std::string>() << "/step" << std::setw(3)
       << std::setfill('0') << i << "_";

    for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
      std::ofstream fs(ss.str() + "agent" + std::to_string(agent) + ".dot");
      print(fs, bp.improved_policy.local_policy(agent),
            pgi::element_names(jas.get(agent)),
            pgi::element_names(jos.get(agent)));
    }
  }

  pgi::ForwardPassParticle<pgi::GraphSensing::state_t> fwd(init_particles, jp,
                                                           t, o, jas, jos, rng);
  std::cout << "Forward pass results: \n";
  for (unsigned int s = 1; s <= jp.max_steps(); ++s) {
  for (auto& q : jp.joint_vertices_with_steps_remaining(s))
  {
    auto ql = jp.to_local(q);
    for (auto& qq : ql)
      std::cout << qq << " ";

    const pgi::ParticleSet<pgi::GraphSensing::state_t>& p = fwd.particles_at(q);
    std::cout << ": " << p.weights_.size() << " particles\n";

  }
  }

  return 0;
}